

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

ngram_file_type_t ngram_str_to_type(char *str_name)

{
  int32 iVar1;
  ngram_file_type_t nVar2;
  
  iVar1 = strcmp_nocase(str_name,"arpa");
  if (iVar1 == 0) {
    nVar2 = NGRAM_ARPA;
  }
  else {
    iVar1 = strcmp_nocase(str_name,"dmp");
    if (iVar1 == 0) {
      nVar2 = NGRAM_BIN;
    }
    else {
      iVar1 = strcmp_nocase(str_name,"bin");
      nVar2 = -(uint)(iVar1 != 0) | NGRAM_BIN;
    }
  }
  return nVar2;
}

Assistant:

ngram_file_type_t
ngram_str_to_type(const char *str_name)
{
    if (0 == strcmp_nocase(str_name, "arpa"))
        return NGRAM_ARPA;
    if (0 == strcmp_nocase(str_name, "dmp")
        || 0 == strcmp_nocase(str_name, "bin"))
        return NGRAM_BIN;
    return NGRAM_INVALID;
}